

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

bool mkvparser::MasteringMetadata::Parse
               (IMkvReader *reader,longlong mm_start,longlong mm_size,MasteringMetadata **mm)

{
  MasteringMetadata *pMVar1;
  long lVar2;
  pointer *__ptr;
  bool bVar3;
  MasteringMetadata *chromaticity;
  long stop;
  bool bVar4;
  float fVar5;
  unique_ptr<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
  mm_ptr;
  longlong read_pos;
  double value;
  longlong child_size;
  longlong child_id;
  MasteringMetadata *local_58;
  long local_50;
  double local_48;
  longlong local_40;
  longlong local_38;
  
  if ((reader == (IMkvReader *)0x0) || (*mm != (MasteringMetadata *)0x0)) {
    bVar3 = false;
  }
  else {
    pMVar1 = (MasteringMetadata *)operator_new(0x28,(nothrow_t *)&std::nothrow);
    if (pMVar1 == (MasteringMetadata *)0x0) {
      pMVar1 = (MasteringMetadata *)0x0;
    }
    else {
      pMVar1->b = (PrimaryChromaticity *)0x0;
      pMVar1->white_point = (PrimaryChromaticity *)0x0;
      pMVar1->r = (PrimaryChromaticity *)0x0;
      pMVar1->g = (PrimaryChromaticity *)0x0;
      pMVar1->luminance_max = 3.4028235e+38;
      pMVar1->luminance_min = 3.4028235e+38;
    }
    local_58 = pMVar1;
    if (pMVar1 == (MasteringMetadata *)0x0) {
      bVar3 = false;
    }
    else {
      stop = mm_size + mm_start;
      local_50 = mm_start;
      while (bVar3 = stop <= local_50, local_50 < stop) {
        local_38 = 0;
        local_40 = 0;
        lVar2 = ParseElementHeader(reader,&local_50,stop,&local_38,&local_40);
        if (lVar2 < 0) goto switchD_0012d41b_default;
        switch(local_38) {
        case 0x55d1:
        case 0x55d2:
          bVar4 = local_38 == 0x55d1;
          chromaticity = pMVar1;
          break;
        case 0x55d3:
        case 0x55d4:
          bVar4 = local_38 == 0x55d3;
          chromaticity = (MasteringMetadata *)&pMVar1->g;
          break;
        case 0x55d5:
        case 0x55d6:
          bVar4 = local_38 == 0x55d5;
          chromaticity = (MasteringMetadata *)&pMVar1->b;
          break;
        case 0x55d7:
        case 0x55d8:
          bVar4 = local_38 == 0x55d7;
          chromaticity = (MasteringMetadata *)&pMVar1->white_point;
          break;
        case 0x55d9:
          local_48 = 0.0;
          lVar2 = UnserializeFloat(reader,local_50,local_40,&local_48);
          if ((ABS(local_48) <= 3.4028234663852886e+38) &&
             ((local_48 <= 0.0 || (1.1754943508222875e-38 <= local_48)))) {
            fVar5 = (float)local_48;
            pMVar1->luminance_max = fVar5;
            if ((-1 < lVar2) && ((0.0 <= fVar5 && (fVar5 <= 9999.99)))) goto LAB_0012d480;
          }
          goto switchD_0012d41b_default;
        case 0x55da:
          local_48 = 0.0;
          lVar2 = UnserializeFloat(reader,local_50,local_40,&local_48);
          if ((ABS(local_48) <= 3.4028234663852886e+38) &&
             ((local_48 <= 0.0 || (1.1754943508222875e-38 <= local_48)))) {
            fVar5 = (float)local_48;
            pMVar1->luminance_min = fVar5;
            if ((-1 < lVar2) && ((0.0 <= fVar5 && (fVar5 <= 999.9999)))) goto LAB_0012d480;
          }
        default:
          goto switchD_0012d41b_default;
        }
        bVar4 = PrimaryChromaticity::Parse(reader,local_50,local_40,bVar4,&chromaticity->r);
        if (!bVar4) goto switchD_0012d41b_default;
LAB_0012d480:
        local_50 = local_50 + local_40;
        if (stop < local_50) goto switchD_0012d41b_default;
      }
      local_58 = (MasteringMetadata *)0x0;
      *mm = pMVar1;
    }
switchD_0012d41b_default:
    if (local_58 != (MasteringMetadata *)0x0) {
      ~MasteringMetadata(local_58);
      operator_delete(local_58);
    }
  }
  return bVar3;
}

Assistant:

bool MasteringMetadata::Parse(IMkvReader* reader, long long mm_start,
                              long long mm_size, MasteringMetadata** mm) {
  if (!reader || *mm)
    return false;

  std::unique_ptr<MasteringMetadata> mm_ptr(new (std::nothrow)
                                                MasteringMetadata());
  if (!mm_ptr)
    return false;

  const long long mm_end = mm_start + mm_size;
  long long read_pos = mm_start;

  while (read_pos < mm_end) {
    long long child_id = 0;
    long long child_size = 0;

    const long long status =
        ParseElementHeader(reader, read_pos, mm_end, child_id, child_size);
    if (status < 0)
      return false;

    if (child_id == libwebm::kMkvLuminanceMax) {
      double value = 0;
      const long long value_parse_status =
          UnserializeFloat(reader, read_pos, child_size, value);
      if (value < -FLT_MAX || value > FLT_MAX ||
          (value > 0.0 && value < FLT_MIN)) {
        return false;
      }
      mm_ptr->luminance_max = static_cast<float>(value);
      if (value_parse_status < 0 || mm_ptr->luminance_max < 0.0 ||
          mm_ptr->luminance_max > 9999.99) {
        return false;
      }
    } else if (child_id == libwebm::kMkvLuminanceMin) {
      double value = 0;
      const long long value_parse_status =
          UnserializeFloat(reader, read_pos, child_size, value);
      if (value < -FLT_MAX || value > FLT_MAX ||
          (value > 0.0 && value < FLT_MIN)) {
        return false;
      }
      mm_ptr->luminance_min = static_cast<float>(value);
      if (value_parse_status < 0 || mm_ptr->luminance_min < 0.0 ||
          mm_ptr->luminance_min > 999.9999) {
        return false;
      }
    } else {
      bool is_x = false;
      PrimaryChromaticity** chromaticity;
      switch (child_id) {
        case libwebm::kMkvPrimaryRChromaticityX:
        case libwebm::kMkvPrimaryRChromaticityY:
          is_x = child_id == libwebm::kMkvPrimaryRChromaticityX;
          chromaticity = &mm_ptr->r;
          break;
        case libwebm::kMkvPrimaryGChromaticityX:
        case libwebm::kMkvPrimaryGChromaticityY:
          is_x = child_id == libwebm::kMkvPrimaryGChromaticityX;
          chromaticity = &mm_ptr->g;
          break;
        case libwebm::kMkvPrimaryBChromaticityX:
        case libwebm::kMkvPrimaryBChromaticityY:
          is_x = child_id == libwebm::kMkvPrimaryBChromaticityX;
          chromaticity = &mm_ptr->b;
          break;
        case libwebm::kMkvWhitePointChromaticityX:
        case libwebm::kMkvWhitePointChromaticityY:
          is_x = child_id == libwebm::kMkvWhitePointChromaticityX;
          chromaticity = &mm_ptr->white_point;
          break;
        default:
          return false;
      }
      const bool value_parse_status = PrimaryChromaticity::Parse(
          reader, read_pos, child_size, is_x, chromaticity);
      if (!value_parse_status)
        return false;
    }

    read_pos += child_size;
    if (read_pos > mm_end)
      return false;
  }

  *mm = mm_ptr.release();
  return true;
}